

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall
QMdiAreaPrivate::_q_deactivateAllWindows(QMdiAreaPrivate *this,QMdiSubWindow *aboutToActivate)

{
  QWidget *this_00;
  QPointer<QMdiSubWindow> *pQVar1;
  long lVar2;
  Data *pDVar3;
  bool bVar4;
  byte bVar5;
  QObject *object;
  QWidget *pQVar6;
  long lVar7;
  QWidget *this_01;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->ignoreWindowStateChange == false) {
    this_00 = *(QWidget **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    if (aboutToActivate == (QMdiSubWindow *)0x0) {
      object = (QObject *)QObject::sender();
      aboutToActivate = QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>(object);
    }
    QWeakPointer<QObject>::assign<QObject>
              (&(this->aboutToBecomeActive).wp,(QObject *)aboutToActivate);
    local_50.d = (this->childWindows).d.d;
    pQVar1 = (this->childWindows).d.ptr;
    local_50.size = (this->childWindows).d.size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar8 = local_50.size * 0x10;
    local_50.ptr = pQVar1;
    for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 0x10) {
      lVar2 = *(long *)((long)&(pQVar1->wp).d + lVar7);
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        this_01 = (QWidget *)0x0;
      }
      else {
        this_01 = *(QWidget **)((long)&(pQVar1->wp).value + lVar7);
      }
      bVar4 = sanityCheck((QMdiSubWindow *)this_01,"QMdiArea::deactivateAllWindows");
      if (bVar4) {
        pDVar3 = (this->aboutToBecomeActive).wp.d;
        if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
          pQVar6 = (QWidget *)0x0;
        }
        else {
          pQVar6 = (QWidget *)(this->aboutToBecomeActive).wp.value;
        }
        if (pQVar6 != this_01) {
          this->ignoreWindowStateChange = true;
          bVar5 = this->showActiveWindowMaximized;
          if ((((this->options).super_QFlagsStorageHelper<QMdiArea::AreaOption,_4>.
                super_QFlagsStorage<QMdiArea::AreaOption>.i & 1) == 0) && ((bVar5 & 1) == 0)) {
            bVar4 = QWidget::isMaximized(this_01);
            if (bVar4) {
              bVar5 = (byte)(this_01->data->widget_attributes >> 0xf) & 1;
            }
            else {
              bVar5 = false;
            }
            this->showActiveWindowMaximized = (bool)bVar5;
          }
          if (((bVar5 & 1) != 0) && (bVar4 = QWidget::isMaximized(this_01), bVar4)) {
            if ((this_00->data->widget_attributes & 0x400) == 0) {
              this->updatesDisabledByUs = true;
              QWidget::setUpdatesEnabled(this_00,false);
            }
            QWidget::showNormal(this_01);
          }
          bVar4 = QWidget::isMinimized(this_01);
          if (((bVar4) && (bVar4 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_01), !bVar4)) &&
             (((this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 0x40000) == 0)) {
            QWidget::lower(this_01);
          }
          this->ignoreWindowStateChange = false;
          QMdiSubWindowPrivate::setActive(*(QMdiSubWindowPrivate **)&this_01->field_0x8,false,true);
        }
      }
    }
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::_q_deactivateAllWindows(QMdiSubWindow *aboutToActivate)
{
    if (ignoreWindowStateChange)
        return;

    Q_Q(QMdiArea);
    if (!aboutToActivate)
        aboutToBecomeActive = qobject_cast<QMdiSubWindow *>(q->sender());
    else
        aboutToBecomeActive = aboutToActivate;
    Q_ASSERT(aboutToBecomeActive);

    // Take a copy because child->showNormal() could indirectly call
    // QCoreApplication::sendEvent(), which could call unknown code that e.g.
    // recurses into the class modifying childWindows.
    const auto subWindows = childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::deactivateAllWindows") || aboutToBecomeActive == child)
            continue;
        // We don't want to handle signals caused by child->showNormal().
        ignoreWindowStateChange = true;
        if (!(options & QMdiArea::DontMaximizeSubWindowOnActivation) && !showActiveWindowMaximized)
            showActiveWindowMaximized = child->isMaximized() && child->isVisible();
        if (showActiveWindowMaximized && child->isMaximized()) {
            if (q->updatesEnabled()) {
                updatesDisabledByUs = true;
                q->setUpdatesEnabled(false);
            }
            child->showNormal();
        }
        if (child->isMinimized() && !child->isShaded() && !windowStaysOnTop(child))
            child->lower();
        ignoreWindowStateChange = false;
        child->d_func()->setActive(false);
    }
}